

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

bool __thiscall
wallet::BerkeleyROBatch::ReadKey(BerkeleyROBatch *this,DataStream *key,DataStream *value)

{
  pointer pbVar1;
  const_iterator cVar2;
  allocator_type *__a;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> val;
  SerializeData key_data;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_50;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __a = (allocator_type *)&local_50;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::
  vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_38,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )((key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + key->m_read_pos),
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )(key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,__a);
  cVar2 = std::
          _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          ::find(&(this->m_database->m_records)._M_t,(key_type *)&local_38);
  p_Var3 = &(this->m_database->m_records)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::vector
              ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_50,
               (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
               &cVar2._M_node[1]._M_right);
    pbVar1 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar1) {
      (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar1;
    }
    value->m_read_pos = 0;
    DataStream::write(value,(int)local_50._M_impl.super__Vector_impl_data._M_start,
                      local_50._M_impl.super__Vector_impl_data._M_finish +
                      -(long)local_50._M_impl.super__Vector_impl_data._M_start,(size_t)__a);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_50);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (_Rb_tree_header *)cVar2._M_node != p_Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool BerkeleyROBatch::ReadKey(DataStream&& key, DataStream& value)
{
    SerializeData key_data{key.begin(), key.end()};
    const auto it{m_database.m_records.find(key_data)};
    if (it == m_database.m_records.end()) {
        return false;
    }
    auto val = it->second;
    value.clear();
    value.write(Span(val));
    return true;
}